

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O2

void dmrC_dump_macro_definitions(dmr_C *C)

{
  dmr_C *C_00;
  ident_list *sym;
  ident_list *head;
  undefined1 local_30 [8];
  ptr_list_iter nameiter__;
  
  head = C->macros;
  ptrlist_forward_iterator((ptr_list_iter *)local_30,(ptr_list *)head);
  while( true ) {
    C_00 = (dmr_C *)ptrlist_iter_next((ptr_list_iter *)local_30);
    if (C_00 == (dmr_C *)0x0) break;
    sym = (ident_list *)lookup_macro(C_00,(ident *)head);
    if (sym != (ident_list *)0x0) {
      dump_macro(C,(symbol *)sym);
      head = sym;
    }
  }
  return;
}

Assistant:

void dmrC_dump_macro_definitions(struct dmr_C *C)
{
	struct ident *name;

	FOR_EACH_PTR(C->macros, name) {
		struct symbol *sym = lookup_macro(C, name);
		if (sym)
			dump_macro(C, sym);
	} END_FOR_EACH_PTR(name);
}